

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx::PointsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,PointsISA *this,mvector<PrimRefMB> *prims,BBox1f *t0t1
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  RawBufferView *pRVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  BBox1f BVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  size_t sVar8;
  PrimRefMB *pPVar9;
  bool bVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar14;
  float fVar15;
  int iVar16;
  uint uVar17;
  undefined4 uVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  size_t sVar23;
  size_t sVar24;
  long lVar25;
  uint index;
  ulong uVar26;
  ulong uVar27;
  size_t *psVar28;
  ulong uVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  float fVar47;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  float fVar49;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar60;
  undefined1 auVar56 [16];
  float fVar58;
  float fVar59;
  undefined1 auVar57 [64];
  float fVar61;
  float fVar63;
  float fVar64;
  undefined1 auVar62 [16];
  float fVar65;
  undefined1 auVar66 [16];
  float fVar71;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  float fVar69;
  float fVar70;
  undefined1 auVar68 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar74;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar78;
  undefined1 auVar79 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar80;
  undefined1 auVar81 [64];
  unsigned_long local_d8;
  size_t local_d0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 auVar75 [64];
  
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[3] = -INFINITY;
  local_a8._8_4_ = 0x7f800000;
  local_a8._0_8_ = 0x7f8000007f800000;
  local_a8._12_4_ = 0x7f800000;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  local_b8._8_4_ = 0xff800000;
  local_b8._0_8_ = 0xff800000ff800000;
  local_b8._12_4_ = 0xff800000;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar31._8_4_ = 0x3f800000;
  auVar31._0_8_ = &DAT_3f8000003f800000;
  auVar31._12_4_ = 0x3f800000;
  uVar5 = vmovlps_avx(auVar31);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar5;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar26 = r->_begin;
  local_d0 = __return_storage_ptr__->num_time_segments;
  sVar23 = __return_storage_ptr__->max_num_time_segments;
  auVar33._0_4_ = (__return_storage_ptr__->max_time_range).lower;
  auVar33._4_4_ = (__return_storage_ptr__->max_time_range).upper;
  auVar33._8_4_ = (__return_storage_ptr__->time_range).lower;
  auVar33._12_4_ = (__return_storage_ptr__->time_range).upper;
  auVar43 = ZEXT1664(auVar33);
  if (uVar26 < r->_end) {
    local_d8 = (__return_storage_ptr__->object_range)._end;
    auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar72._8_4_ = 0x7f800000;
    auVar72._0_8_ = 0x7f8000007f800000;
    auVar72._12_4_ = 0x7f800000;
    auVar75 = ZEXT1664(auVar72);
    auVar81 = ZEXT1664(auVar72);
    auVar42._8_4_ = 0xff800000;
    auVar42._0_8_ = 0xff800000ff800000;
    auVar42._12_4_ = 0xff800000;
    auVar68 = ZEXT1664(auVar42);
    auVar79 = ZEXT1664(auVar42);
    do {
      BVar6 = (this->super_Points).super_Geometry.time_range;
      auVar32._8_8_ = 0;
      auVar32._0_4_ = BVar6.lower;
      auVar32._4_4_ = BVar6.upper;
      auVar33 = vmovshdup_avx(auVar32);
      fVar30 = BVar6.lower;
      fVar15 = auVar33._0_4_ - fVar30;
      uVar29 = uVar26 & 0xffffffff;
      pBVar7 = (this->super_Points).vertices.items;
      sVar24 = k;
      if (uVar29 < (pBVar7->super_RawBufferView).num) {
        fVar2 = (this->super_Points).super_Geometry.fnumTimeSegments;
        auVar33 = ZEXT416((uint)(fVar2 * ((t0t1->upper - fVar30) / fVar15) * 0.99999976));
        auVar33 = vroundss_avx(auVar33,auVar33,10);
        auVar33 = vminss_avx(auVar33,ZEXT416((uint)fVar2));
        uVar22 = (uint)auVar33._0_4_;
        auVar33 = ZEXT416((uint)(fVar2 * ((t0t1->lower - fVar30) / fVar15) * 1.0000002));
        auVar33 = vroundss_avx(auVar33,auVar33,9);
        auVar33 = vmaxss_avx(auVar57._0_16_,auVar33);
        uVar17 = (uint)auVar33._0_4_;
        bVar10 = uVar22 < uVar17;
        if (uVar17 <= uVar22) {
          uVar27 = (ulong)(int)uVar17;
          pcVar19 = pBVar7[uVar27].super_RawBufferView.ptr_ofs;
          lVar20 = pBVar7[uVar27].super_RawBufferView.stride * uVar29;
          if (0.0 <= *(float *)(pcVar19 + lVar20 + 0xc)) {
            auVar33 = *(undefined1 (*) [16])(pcVar19 + lVar20);
            auVar36._8_4_ = 0xddccb9a2;
            auVar36._0_8_ = 0xddccb9a2ddccb9a2;
            auVar36._12_4_ = 0xddccb9a2;
            auVar31 = vcmpps_avx(auVar33,auVar36,2);
            auVar44._8_4_ = 0x5dccb9a2;
            auVar44._0_8_ = 0x5dccb9a25dccb9a2;
            auVar44._12_4_ = 0x5dccb9a2;
            auVar33 = vcmpps_avx(auVar33,auVar44,5);
            auVar33 = vorps_avx(auVar31,auVar33);
            uVar18 = vmovmskps_avx(auVar33);
            if ((char)uVar18 == '\0') {
              psVar28 = &pBVar7[uVar27 + 1].super_RawBufferView.stride;
              do {
                uVar27 = uVar27 + 1;
                bVar10 = (ulong)(long)(int)uVar22 < uVar27;
                if ((ulong)(long)(int)uVar22 < uVar27) goto LAB_0132a062;
                pRVar1 = (RawBufferView *)(psVar28 + -2);
                sVar8 = *psVar28;
                if (*(float *)(pRVar1->ptr_ofs + sVar8 * uVar29 + 0xc) < 0.0) break;
                psVar28 = psVar28 + 7;
                auVar33 = *(undefined1 (*) [16])(pRVar1->ptr_ofs + sVar8 * uVar29);
                auVar37._8_4_ = 0xddccb9a2;
                auVar37._0_8_ = 0xddccb9a2ddccb9a2;
                auVar37._12_4_ = 0xddccb9a2;
                auVar31 = vcmpps_avx(auVar33,auVar37,2);
                auVar45._8_4_ = 0x5dccb9a2;
                auVar45._0_8_ = 0x5dccb9a25dccb9a2;
                auVar45._12_4_ = 0x5dccb9a2;
                auVar33 = vcmpps_avx(auVar33,auVar45,5);
                auVar33 = vorps_avx(auVar31,auVar33);
                uVar18 = vmovmskps_avx(auVar33);
              } while ((char)uVar18 == '\0');
            }
          }
          if (!bVar10) goto LAB_0132a489;
        }
LAB_0132a062:
        auVar32 = auVar43._0_16_;
        fVar15 = (this->super_Points).super_Geometry.time_range.lower;
        fVar39 = (this->super_Points).super_Geometry.time_range.upper - fVar15;
        fVar61 = (t0t1->lower - fVar15) / fVar39;
        fVar39 = (t0t1->upper - fVar15) / fVar39;
        fVar15 = fVar2 * fVar61;
        fVar30 = fVar2 * fVar39;
        auVar42 = vroundss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15),9);
        auVar72 = vroundss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),10);
        auVar33 = vmaxss_avx(auVar42,auVar57._0_16_);
        auVar31 = vminss_avx(auVar72,ZEXT416((uint)fVar2));
        fVar47 = auVar31._0_4_;
        iVar16 = (int)auVar42._0_4_;
        if ((int)auVar42._0_4_ < 0) {
          iVar16 = -1;
        }
        uVar17 = (int)fVar2 + 1U;
        if ((int)auVar72._0_4_ < (int)((int)fVar2 + 1U)) {
          uVar17 = (int)auVar72._0_4_;
        }
        lVar20 = (long)(int)auVar33._0_4_;
        pBVar7 = (this->super_Points).vertices.items;
        pcVar19 = pBVar7[lVar20].super_RawBufferView.ptr_ofs;
        lVar21 = pBVar7[lVar20].super_RawBufferView.stride * uVar26;
        auVar31 = *(undefined1 (*) [16])(pcVar19 + lVar21);
        fVar3 = (this->super_Points).maxRadiusScale;
        auVar42 = ZEXT416((uint)(fVar3 * *(float *)(pcVar19 + lVar21 + 0xc)));
        auVar42 = vshufps_avx(auVar42,auVar42,0);
        auVar72 = vsubps_avx(auVar31,auVar42);
        fVar49 = auVar31._0_4_ + auVar42._0_4_;
        fVar52 = auVar31._4_4_ + auVar42._4_4_;
        fVar53 = auVar31._8_4_ + auVar42._8_4_;
        fVar54 = auVar31._12_4_ + auVar42._12_4_;
        lVar21 = (long)(int)fVar47;
        pcVar19 = pBVar7[lVar21].super_RawBufferView.ptr_ofs;
        lVar25 = pBVar7[lVar21].super_RawBufferView.stride * uVar26;
        auVar44 = ZEXT816(0) << 0x40;
        auVar31 = *(undefined1 (*) [16])(pcVar19 + lVar25);
        auVar42 = ZEXT416((uint)(fVar3 * *(float *)(pcVar19 + lVar25 + 0xc)));
        auVar42 = vshufps_avx(auVar42,auVar42,0);
        auVar36 = vsubps_avx(auVar31,auVar42);
        fVar55 = auVar42._0_4_ + auVar31._0_4_;
        fVar58 = auVar42._4_4_ + auVar31._4_4_;
        fVar59 = auVar42._8_4_ + auVar31._8_4_;
        fVar60 = auVar42._12_4_ + auVar31._12_4_;
        pcVar19 = (char *)(ulong)(uVar17 - iVar16);
        auVar33 = ZEXT416((uint)(fVar15 - auVar33._0_4_));
        fVar48 = auVar36._0_4_;
        fVar63 = auVar36._4_4_;
        fVar64 = auVar36._8_4_;
        fVar15 = auVar36._12_4_;
        fVar65 = auVar72._0_4_;
        fVar69 = auVar72._4_4_;
        fVar70 = auVar72._8_4_;
        fVar71 = auVar72._12_4_;
        if (uVar17 - iVar16 == 1) {
          auVar33 = vmaxss_avx(auVar33,auVar44);
          auVar31 = vshufps_avx(auVar33,auVar33,0);
          auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          auVar62._0_4_ = auVar31._0_4_ * fVar48 + fVar65 * auVar33._0_4_;
          auVar62._4_4_ = auVar31._4_4_ * fVar63 + fVar69 * auVar33._4_4_;
          auVar62._8_4_ = auVar31._8_4_ * fVar64 + fVar70 * auVar33._8_4_;
          auVar62._12_4_ = auVar31._12_4_ * fVar15 + fVar71 * auVar33._12_4_;
          auVar66._0_4_ = auVar31._0_4_ * fVar55 + fVar49 * auVar33._0_4_;
          auVar66._4_4_ = auVar31._4_4_ * fVar58 + fVar52 * auVar33._4_4_;
          auVar66._8_4_ = auVar31._8_4_ * fVar59 + fVar53 * auVar33._8_4_;
          auVar66._12_4_ = auVar31._12_4_ * fVar60 + fVar54 * auVar33._12_4_;
          auVar33 = vmaxss_avx(ZEXT416((uint)(fVar47 - fVar30)),auVar44);
          auVar31 = vshufps_avx(auVar33,auVar33,0);
          auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          auVar77._0_4_ = fVar65 * auVar31._0_4_ + fVar48 * auVar33._0_4_;
          auVar77._4_4_ = fVar69 * auVar31._4_4_ + fVar63 * auVar33._4_4_;
          auVar77._8_4_ = fVar70 * auVar31._8_4_ + fVar64 * auVar33._8_4_;
          auVar77._12_4_ = fVar71 * auVar31._12_4_ + fVar15 * auVar33._12_4_;
          auVar46._0_4_ = fVar49 * auVar31._0_4_ + fVar55 * auVar33._0_4_;
          auVar46._4_4_ = fVar52 * auVar31._4_4_ + fVar58 * auVar33._4_4_;
          auVar46._8_4_ = fVar53 * auVar31._8_4_ + fVar59 * auVar33._8_4_;
          auVar46._12_4_ = fVar54 * auVar31._12_4_ + fVar60 * auVar33._12_4_;
        }
        else {
          pcVar19 = pBVar7[lVar20 + 1].super_RawBufferView.ptr_ofs;
          lVar20 = pBVar7[lVar20 + 1].super_RawBufferView.stride * uVar26;
          auVar31 = *(undefined1 (*) [16])(pcVar19 + lVar20);
          fVar4 = *(float *)(pcVar19 + lVar20 + 0xc);
          auVar73._0_4_ = fVar3 * fVar4;
          auVar73._4_4_ = fVar3 * fVar4;
          auVar73._8_4_ = fVar3 * fVar4;
          auVar73._12_4_ = fVar3 * fVar4;
          auVar36 = vsubps_avx(auVar31,auVar73);
          pcVar19 = pBVar7[lVar21 + -1].super_RawBufferView.ptr_ofs;
          lVar20 = pBVar7[lVar21 + -1].super_RawBufferView.stride * uVar26;
          auVar42 = *(undefined1 (*) [16])(pcVar19 + lVar20);
          fVar4 = *(float *)(pcVar19 + lVar20 + 0xc);
          auVar76._0_4_ = fVar3 * fVar4;
          auVar76._4_4_ = fVar3 * fVar4;
          auVar76._8_4_ = fVar3 * fVar4;
          auVar76._12_4_ = fVar3 * fVar4;
          auVar37 = vsubps_avx(auVar42,auVar76);
          auVar33 = vmaxss_avx(auVar33,auVar44);
          auVar72 = vshufps_avx(auVar33,auVar33,0);
          auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          auVar62._0_4_ = auVar33._0_4_ * fVar65 + auVar72._0_4_ * auVar36._0_4_;
          auVar62._4_4_ = auVar33._4_4_ * fVar69 + auVar72._4_4_ * auVar36._4_4_;
          auVar62._8_4_ = auVar33._8_4_ * fVar70 + auVar72._8_4_ * auVar36._8_4_;
          auVar62._12_4_ = auVar33._12_4_ * fVar71 + auVar72._12_4_ * auVar36._12_4_;
          auVar66._0_4_ = auVar33._0_4_ * fVar49 + (auVar31._0_4_ + auVar73._0_4_) * auVar72._0_4_;
          auVar66._4_4_ = auVar33._4_4_ * fVar52 + (auVar31._4_4_ + auVar73._4_4_) * auVar72._4_4_;
          auVar66._8_4_ = auVar33._8_4_ * fVar53 + (auVar31._8_4_ + auVar73._8_4_) * auVar72._8_4_;
          auVar66._12_4_ =
               auVar33._12_4_ * fVar54 + (auVar31._12_4_ + auVar73._12_4_) * auVar72._12_4_;
          auVar33 = vmaxss_avx(ZEXT416((uint)(fVar47 - fVar30)),ZEXT416(0));
          auVar31 = vshufps_avx(auVar33,auVar33,0);
          local_88 = auVar37._0_4_;
          fStack_84 = auVar37._4_4_;
          fStack_80 = auVar37._8_4_;
          fStack_7c = auVar37._12_4_;
          auVar33 = ZEXT416((uint)(1.0 - auVar33._0_4_));
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          auVar77._0_4_ = fVar48 * auVar33._0_4_ + auVar31._0_4_ * local_88;
          auVar77._4_4_ = fVar63 * auVar33._4_4_ + auVar31._4_4_ * fStack_84;
          auVar77._8_4_ = fVar64 * auVar33._8_4_ + auVar31._8_4_ * fStack_80;
          auVar77._12_4_ = fVar15 * auVar33._12_4_ + auVar31._12_4_ * fStack_7c;
          auVar46._0_4_ = fVar55 * auVar33._0_4_ + (auVar42._0_4_ + auVar76._0_4_) * auVar31._0_4_;
          auVar46._4_4_ = fVar58 * auVar33._4_4_ + (auVar42._4_4_ + auVar76._4_4_) * auVar31._4_4_;
          auVar46._8_4_ = fVar59 * auVar33._8_4_ + (auVar42._8_4_ + auVar76._8_4_) * auVar31._8_4_;
          auVar46._12_4_ =
               fVar60 * auVar33._12_4_ + (auVar42._12_4_ + auVar76._12_4_) * auVar31._12_4_;
          uVar22 = iVar16 + 1;
          if ((int)uVar22 < (int)uVar17) {
            psVar28 = &pBVar7[uVar22].super_RawBufferView.stride;
            do {
              auVar34._0_4_ = ((float)(int)uVar22 / fVar2 - fVar61) / (fVar39 - fVar61);
              auVar34._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar33 = vshufps_avx(auVar34,auVar34,0);
              fVar49 = auVar77._4_4_;
              fVar52 = auVar77._8_4_;
              fVar53 = auVar77._12_4_;
              auVar31 = vshufps_avx(ZEXT416((uint)(1.0 - auVar34._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar34._0_4_)),0);
              fVar63 = auVar62._4_4_;
              fVar64 = auVar62._8_4_;
              fVar65 = auVar62._12_4_;
              auVar40._0_4_ = auVar77._0_4_ * auVar33._0_4_ + auVar62._0_4_ * auVar31._0_4_;
              auVar40._4_4_ = fVar49 * auVar33._4_4_ + fVar63 * auVar31._4_4_;
              auVar40._8_4_ = fVar52 * auVar33._8_4_ + fVar64 * auVar31._8_4_;
              auVar40._12_4_ = fVar53 * auVar33._12_4_ + fVar65 * auVar31._12_4_;
              fVar30 = auVar46._4_4_;
              fVar47 = auVar46._8_4_;
              fVar48 = auVar46._12_4_;
              fVar69 = auVar66._4_4_;
              fVar70 = auVar66._8_4_;
              fVar71 = auVar66._12_4_;
              auVar35._0_4_ = auVar46._0_4_ * auVar33._0_4_ + auVar66._0_4_ * auVar31._0_4_;
              auVar35._4_4_ = fVar30 * auVar33._4_4_ + fVar69 * auVar31._4_4_;
              auVar35._8_4_ = fVar47 * auVar33._8_4_ + fVar70 * auVar31._8_4_;
              auVar35._12_4_ = fVar48 * auVar33._12_4_ + fVar71 * auVar31._12_4_;
              pcVar19 = ((RawBufferView *)(psVar28 + -2))->ptr_ofs;
              auVar33 = *(undefined1 (*) [16])(pcVar19 + *psVar28 * uVar26);
              fVar15 = *(float *)(pcVar19 + *psVar28 * uVar26 + 0xc);
              auVar50._0_4_ = fVar3 * fVar15;
              auVar50._4_4_ = fVar3 * fVar15;
              auVar50._8_4_ = fVar3 * fVar15;
              auVar50._12_4_ = fVar3 * fVar15;
              auVar31 = vsubps_avx(auVar33,auVar50);
              auVar31 = vsubps_avx(auVar31,auVar40);
              auVar38._0_4_ = auVar33._0_4_ + auVar50._0_4_;
              auVar38._4_4_ = auVar33._4_4_ + auVar50._4_4_;
              auVar38._8_4_ = auVar33._8_4_ + auVar50._8_4_;
              auVar38._12_4_ = auVar33._12_4_ + auVar50._12_4_;
              auVar33 = vsubps_avx(auVar38,auVar35);
              auVar31 = vminps_avx(auVar31,ZEXT816(0));
              auVar33 = vmaxps_avx(auVar33,ZEXT816(0));
              auVar62._0_4_ = auVar62._0_4_ + auVar31._0_4_;
              auVar62._4_4_ = fVar63 + auVar31._4_4_;
              auVar62._8_4_ = fVar64 + auVar31._8_4_;
              auVar62._12_4_ = fVar65 + auVar31._12_4_;
              auVar77._0_4_ = auVar77._0_4_ + auVar31._0_4_;
              auVar77._4_4_ = fVar49 + auVar31._4_4_;
              auVar77._8_4_ = fVar52 + auVar31._8_4_;
              auVar77._12_4_ = fVar53 + auVar31._12_4_;
              auVar66._0_4_ = auVar66._0_4_ + auVar33._0_4_;
              auVar66._4_4_ = fVar69 + auVar33._4_4_;
              auVar66._8_4_ = fVar70 + auVar33._8_4_;
              auVar66._12_4_ = fVar71 + auVar33._12_4_;
              auVar46._0_4_ = auVar46._0_4_ + auVar33._0_4_;
              auVar46._4_4_ = fVar30 + auVar33._4_4_;
              auVar46._8_4_ = fVar47 + auVar33._8_4_;
              auVar46._12_4_ = fVar48 + auVar33._12_4_;
              uVar22 = uVar22 + 1;
              psVar28 = psVar28 + 7;
            } while (uVar17 != uVar22);
          }
        }
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar62,ZEXT416(geomID),0x30);
        uVar17 = (this->super_Points).super_Geometry.numTimeSteps - 1;
        uVar29 = (ulong)uVar17;
        aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar66,ZEXT416((uint)uVar26),0x30);
        aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar77,ZEXT416(uVar17),0x30);
        aVar14 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar46,ZEXT416(uVar17),0x30);
        auVar41._0_4_ = aVar11.x * 0.5 + aVar13.x * 0.5 + aVar12.x * 0.5 + aVar14.x * 0.5;
        auVar41._4_4_ = aVar11.y * 0.5 + aVar13.y * 0.5 + aVar12.y * 0.5 + aVar14.y * 0.5;
        auVar41._8_4_ = aVar11.z * 0.5 + aVar13.z * 0.5 + aVar12.z * 0.5 + aVar14.z * 0.5;
        auVar41._12_4_ =
             aVar11.field_3.w * 0.5 + aVar13.field_3.w * 0.5 +
             aVar12.field_3.w * 0.5 + aVar14.field_3.w * 0.5;
        local_a8 = vminps_avx(local_a8,(undefined1  [16])aVar11);
        local_b8 = vmaxps_avx(local_b8,(undefined1  [16])aVar12);
        auVar33 = vminps_avx(auVar81._0_16_,(undefined1  [16])aVar13);
        auVar81 = ZEXT1664(auVar33);
        auVar33 = vmaxps_avx(auVar79._0_16_,(undefined1  [16])aVar14);
        auVar79 = ZEXT1664(auVar33);
        auVar33 = vminps_avx(auVar75._0_16_,auVar41);
        auVar75 = ZEXT1664(auVar33);
        auVar33 = vmaxps_avx(auVar68._0_16_,auVar41);
        auVar68 = ZEXT1664(auVar33);
        auVar33 = vshufpd_avx(auVar32,auVar32,1);
        BVar6 = (this->super_Points).super_Geometry.time_range;
        auVar51._8_4_ = BVar6.lower;
        auVar51._12_4_ = BVar6.upper;
        auVar51._0_4_ = BVar6.lower;
        auVar51._4_4_ = BVar6.upper;
        auVar33 = vcmpps_avx(auVar33,auVar51,1);
        local_d8 = local_d8 + 1;
        local_d0 = local_d0 + uVar29;
        auVar33 = vshufps_avx(ZEXT416((uint)CONCAT71((int7)((ulong)pcVar19 >> 8),sVar23 < uVar29)),
                              auVar33,0x40);
        auVar42 = vpslld_avx(auVar33,0x1f);
        auVar56._8_8_ = auVar43._8_8_;
        auVar56._0_4_ = BVar6.lower;
        auVar56._4_4_ = BVar6.upper;
        auVar31 = vshufps_avx(auVar56,auVar56,100);
        auVar33 = vblendps_avx(auVar32,auVar51,4);
        auVar33 = vblendvps_avx(auVar33,auVar31,auVar42);
        auVar43 = ZEXT1664(auVar33);
        if (sVar23 <= uVar29) {
          sVar23 = uVar29;
        }
        pPVar9 = prims->items;
        sVar24 = k + 1;
        pPVar9[k].lbounds.bounds0.lower.field_0.field_1 = aVar11;
        pPVar9[k].lbounds.bounds0.upper.field_0.field_1 = aVar12;
        pPVar9[k].lbounds.bounds1.lower.field_0.field_1 = aVar13;
        pPVar9[k].lbounds.bounds1.upper.field_0.field_1 = aVar14;
        BVar6 = (BBox1f)vmovlpd_avx(auVar51);
        pPVar9[k].time_range = BVar6;
        auVar57 = ZEXT864(0) << 0x20;
      }
LAB_0132a489:
      auVar33 = auVar43._0_16_;
      aVar78 = auVar79._0_16_;
      aVar80 = auVar81._0_16_;
      uVar26 = uVar26 + 1;
      k = sVar24;
    } while (uVar26 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_d8;
    aVar74 = auVar75._0_16_;
    aVar67 = auVar68._0_16_;
  }
  else {
    aVar78.m128[2] = -INFINITY;
    aVar78._0_8_ = 0xff800000ff800000;
    aVar78.m128[3] = -INFINITY;
    aVar80.m128[2] = INFINITY;
    aVar80._0_8_ = 0x7f8000007f800000;
    aVar80.m128[3] = INFINITY;
    aVar74 = aVar80;
    aVar67 = aVar78;
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = local_a8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
           bounds0.lower.field_0 + 8) = local_a8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = local_b8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
           bounds0.upper.field_0 + 8) = local_b8._8_8_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar80;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar78;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar74;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar67;
  __return_storage_ptr__->num_time_segments = local_d0;
  __return_storage_ptr__->max_num_time_segments = sVar23;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar33._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar33._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar33._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar33._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims,
                                      const BBox1f& t0t1,
                                      const range<size_t>& r,
                                      size_t k,
                                      unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          if (!valid(j, timeSegmentRange(t0t1)))
            continue;
          const PrimRefMB prim(linearBounds(j, t0t1), this->numTimeSegments(), this->time_range, this->numTimeSegments(), geomID, unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }